

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBenchmarks.hpp
# Opt level: O3

void __thiscall
benchmarks::GenericBenchmarks<descriptors::generic::boost::ConditionVariable>::GenericBenchmarks
          (GenericBenchmarks<descriptors::generic::boost::ConditionVariable> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *local_78;
  size_type local_70;
  char local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  string local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  local_78 = &local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"generic","");
  paVar1 = &(this->super_BenchmarksClass)._name.field_2;
  (this->super_BenchmarksClass)._name._M_dataplus._M_p = (pointer)paVar1;
  if (local_78 == &local_68) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_67,local_68);
    *(undefined8 *)((long)&(this->super_BenchmarksClass)._name.field_2 + 8) = uStack_60;
  }
  else {
    (this->super_BenchmarksClass)._name._M_dataplus._M_p = local_78;
    (this->super_BenchmarksClass)._name.field_2._M_allocated_capacity = CONCAT71(uStack_67,local_68)
    ;
  }
  (this->super_BenchmarksClass)._name._M_string_length = local_70;
  local_70 = 0;
  local_68 = '\0';
  (this->super_BenchmarksClass)._benchmarks.
  super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_BenchmarksClass)._benchmarks.
  super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_BenchmarksClass)._benchmarks.
  super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78 = &local_68;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"create","");
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BenchmarksClass::AddBenchmark<,void(*)(benchmarks::BenchmarkContext&)>
            (&this->super_BenchmarksClass,&local_58,Create,&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

GenericBenchmarks()
            : BenchmarksClass("generic")
        {
            AddBenchmark<>("create", &GenericBenchmarks::Create);
        }